

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

bool __thiscall Reducer::tryToReplaceChild(Reducer *this,Expression **child,Expression *with)

{
  bool bVar1;
  ostream *poVar2;
  string local_50;
  undefined8 local_30;
  Expression *before;
  Expression *with_local;
  Expression **child_local;
  Reducer *this_local;
  
  before = with;
  with_local = (Expression *)child;
  child_local = (Expression **)this;
  bVar1 = isOkReplacement(this,with);
  if (bVar1) {
    bVar1 = wasm::Type::operator!=((Type *)(*(long *)with_local + 8),&before->type);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = shouldTryToReduce(this,1);
      if (bVar1) {
        local_30 = *(undefined8 *)with_local;
        *(Expression **)with_local = before;
        bVar1 = writeAndTestReduction(this);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"|      tryToReplaceChild succeeded (in ");
          getLocation_abi_cxx11_(&local_50,this);
          poVar2 = std::operator<<(poVar2,(string *)&local_50);
          std::operator<<(poVar2,")\n");
          std::__cxx11::string::~string((string *)&local_50);
          noteReduction(this,1);
          this_local._7_1_ = true;
        }
        else {
          *(undefined8 *)with_local = local_30;
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool tryToReplaceChild(Expression*& child, Expression* with) {
    if (!isOkReplacement(with)) {
      return false;
    }
    if (child->type != with->type) {
      return false;
    }
    if (!shouldTryToReduce()) {
      return false;
    }
    auto* before = child;
    child = with;
    if (!writeAndTestReduction()) {
      child = before;
      return false;
    }
    std::cerr << "|      tryToReplaceChild succeeded (in " << getLocation()
              << ")\n";
    // std::cerr << "|      " << before << " => " << with << '\n';
    noteReduction();
    return true;
  }